

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dead_branch_elim_pass.cpp
# Opt level: O0

void __thiscall spvtools::opt::DeadBranchElimPass::FixBlockOrder(DeadBranchElimPass *this)

{
  bool bVar1;
  Analysis set;
  IRContext *pIVar2;
  FeatureManager *this_00;
  anon_class_1_0_00000001 local_59;
  undefined1 local_58 [8];
  ProcessFunction reorder_structured;
  undefined1 local_30 [8];
  ProcessFunction reorder_dominators;
  DeadBranchElimPass *this_local;
  
  reorder_dominators._M_invoker = (_Invoker_type)this;
  pIVar2 = Pass::context((Pass *)this);
  set = operator|(kAnalysisCFG,kAnalysisDominatorAnalysis);
  IRContext::BuildInvalidAnalyses(pIVar2,set);
  reorder_structured._M_invoker = (_Invoker_type)this;
  std::function<bool(spvtools::opt::Function*)>::
  function<spvtools::opt::DeadBranchElimPass::FixBlockOrder()::__0,void>
            ((function<bool(spvtools::opt::Function*)> *)local_30,
             (anon_class_8_1_8991fb9c *)&reorder_structured._M_invoker);
  std::function<bool(spvtools::opt::Function*)>::
  function<spvtools::opt::DeadBranchElimPass::FixBlockOrder()::__1,void>
            ((function<bool(spvtools::opt::Function*)> *)local_58,&local_59);
  pIVar2 = Pass::context((Pass *)this);
  this_00 = IRContext::get_feature_mgr(pIVar2);
  bVar1 = FeatureManager::HasCapability(this_00,Shader);
  if (bVar1) {
    pIVar2 = Pass::context((Pass *)this);
    IRContext::ProcessReachableCallTree(pIVar2,(ProcessFunction *)local_58);
  }
  else {
    pIVar2 = Pass::context((Pass *)this);
    IRContext::ProcessReachableCallTree(pIVar2,(ProcessFunction *)local_30);
  }
  std::function<bool_(spvtools::opt::Function_*)>::~function
            ((function<bool_(spvtools::opt::Function_*)> *)local_58);
  std::function<bool_(spvtools::opt::Function_*)>::~function
            ((function<bool_(spvtools::opt::Function_*)> *)local_30);
  return;
}

Assistant:

void DeadBranchElimPass::FixBlockOrder() {
  context()->BuildInvalidAnalyses(IRContext::kAnalysisCFG |
                                  IRContext::kAnalysisDominatorAnalysis);
  // Reorders blocks according to DFS of dominator tree.
  ProcessFunction reorder_dominators = [this](Function* function) {
    DominatorAnalysis* dominators = context()->GetDominatorAnalysis(function);
    std::vector<BasicBlock*> blocks;
    for (auto iter = dominators->GetDomTree().begin();
         iter != dominators->GetDomTree().end(); ++iter) {
      if (iter->id() != 0) {
        blocks.push_back(iter->bb_);
      }
    }
    for (uint32_t i = 1; i < blocks.size(); ++i) {
      function->MoveBasicBlockToAfter(blocks[i]->id(), blocks[i - 1]);
    }
    return true;
  };

  // Reorders blocks according to structured order.
  ProcessFunction reorder_structured = [](Function* function) {
    function->ReorderBasicBlocksInStructuredOrder();
    return true;
  };

  // Structured order is more intuitive so use it where possible.
  if (context()->get_feature_mgr()->HasCapability(spv::Capability::Shader)) {
    context()->ProcessReachableCallTree(reorder_structured);
  } else {
    context()->ProcessReachableCallTree(reorder_dominators);
  }
}